

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image-util.cc
# Opt level: O0

bool tinyusdz::srgb_f32_to_linear_f32
               (vector<float,_std::allocator<float>_> *in_img,size_t width,size_t height,
               size_t channels,size_t channel_stride,vector<float,_std::allocator<float>_> *out_img,
               float scale_factor,float bias,float alpha_scale_factor,float alpha_bias,string *err)

{
  ostream *poVar1;
  ulong uVar2;
  size_type sVar3;
  const_reference pvVar4;
  reference pvVar5;
  float fVar6;
  float f_1;
  size_t idx_1;
  size_t c_1;
  float f;
  size_t idx;
  size_t c;
  size_t x;
  size_t y;
  size_type local_a60;
  allocator local_a51;
  string local_a50 [32];
  string local_a30;
  ostringstream local_a10 [8];
  ostringstream ss_e_5;
  undefined1 local_898 [8];
  size_t dest_size;
  allocator local_869;
  string local_868 [32];
  string local_848;
  ostringstream local_828 [8];
  ostringstream ss_e_4;
  string local_6b0 [32];
  ostringstream local_690 [8];
  ostringstream ss_e_3;
  string local_518 [32];
  ostringstream local_4f8 [8];
  ostringstream ss_e_2;
  string local_380 [32];
  ostringstream local_360 [8];
  ostringstream ss_e_1;
  string local_1e8 [32];
  ostringstream local_1c8 [8];
  ostringstream ss_e;
  float alpha_bias_local;
  float alpha_scale_factor_local;
  float bias_local;
  float scale_factor_local;
  vector<float,_std::allocator<float>_> *out_img_local;
  size_t channel_stride_local;
  size_t channels_local;
  size_t height_local;
  size_t width_local;
  vector<float,_std::allocator<float>_> *in_img_local;
  
  out_img_local = (vector<float,_std::allocator<float>_> *)channel_stride;
  channel_stride_local = channels;
  channels_local = height;
  height_local = width;
  width_local = (size_t)in_img;
  if (width == 0) {
    ::std::__cxx11::ostringstream::ostringstream(local_1c8);
    poVar1 = ::std::operator<<((ostream *)local_1c8,"[error]");
    poVar1 = ::std::operator<<(poVar1,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/image-util.cc"
                              );
    poVar1 = ::std::operator<<(poVar1,":");
    poVar1 = ::std::operator<<(poVar1,"srgb_f32_to_linear_f32");
    poVar1 = ::std::operator<<(poVar1,"():");
    poVar1 = (ostream *)::std::ostream::operator<<(poVar1,0x1da);
    ::std::operator<<(poVar1," ");
    poVar1 = ::std::operator<<((ostream *)local_1c8,"width is zero.");
    ::std::operator<<(poVar1,"\n");
    if (err != (string *)0x0) {
      ::std::__cxx11::ostringstream::str();
      ::std::__cxx11::string::operator+=((string *)err,local_1e8);
      ::std::__cxx11::string::~string(local_1e8);
    }
    in_img_local._7_1_ = 0;
    ::std::__cxx11::ostringstream::~ostringstream(local_1c8);
  }
  else if (height == 0) {
    ::std::__cxx11::ostringstream::ostringstream(local_360);
    poVar1 = ::std::operator<<((ostream *)local_360,"[error]");
    poVar1 = ::std::operator<<(poVar1,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/image-util.cc"
                              );
    poVar1 = ::std::operator<<(poVar1,":");
    poVar1 = ::std::operator<<(poVar1,"srgb_f32_to_linear_f32");
    poVar1 = ::std::operator<<(poVar1,"():");
    poVar1 = (ostream *)::std::ostream::operator<<(poVar1,0x1de);
    ::std::operator<<(poVar1," ");
    poVar1 = ::std::operator<<((ostream *)local_360,"height is zero.");
    ::std::operator<<(poVar1,"\n");
    if (err != (string *)0x0) {
      ::std::__cxx11::ostringstream::str();
      ::std::__cxx11::string::operator+=((string *)err,local_380);
      ::std::__cxx11::string::~string(local_380);
    }
    in_img_local._7_1_ = 0;
    ::std::__cxx11::ostringstream::~ostringstream(local_360);
  }
  else if (channels == 0) {
    ::std::__cxx11::ostringstream::ostringstream(local_4f8);
    poVar1 = ::std::operator<<((ostream *)local_4f8,"[error]");
    poVar1 = ::std::operator<<(poVar1,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/image-util.cc"
                              );
    poVar1 = ::std::operator<<(poVar1,":");
    poVar1 = ::std::operator<<(poVar1,"srgb_f32_to_linear_f32");
    poVar1 = ::std::operator<<(poVar1,"():");
    poVar1 = (ostream *)::std::ostream::operator<<(poVar1,0x1e2);
    ::std::operator<<(poVar1," ");
    poVar1 = ::std::operator<<((ostream *)local_4f8,"channels is zero.");
    ::std::operator<<(poVar1,"\n");
    if (err != (string *)0x0) {
      ::std::__cxx11::ostringstream::str();
      ::std::__cxx11::string::operator+=((string *)err,local_518);
      ::std::__cxx11::string::~string(local_518);
    }
    in_img_local._7_1_ = 0;
    ::std::__cxx11::ostringstream::~ostringstream(local_4f8);
  }
  else if (out_img == (vector<float,_std::allocator<float>_> *)0x0) {
    ::std::__cxx11::ostringstream::ostringstream(local_690);
    poVar1 = ::std::operator<<((ostream *)local_690,"[error]");
    poVar1 = ::std::operator<<(poVar1,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/image-util.cc"
                              );
    poVar1 = ::std::operator<<(poVar1,":");
    poVar1 = ::std::operator<<(poVar1,"srgb_f32_to_linear_f32");
    poVar1 = ::std::operator<<(poVar1,"():");
    poVar1 = (ostream *)::std::ostream::operator<<(poVar1,0x1e6);
    ::std::operator<<(poVar1," ");
    poVar1 = ::std::operator<<((ostream *)local_690,"`out_img` is nullptr.");
    ::std::operator<<(poVar1,"\n");
    if (err != (string *)0x0) {
      ::std::__cxx11::ostringstream::str();
      ::std::__cxx11::string::operator+=((string *)err,local_6b0);
      ::std::__cxx11::string::~string(local_6b0);
    }
    in_img_local._7_1_ = 0;
    ::std::__cxx11::ostringstream::~ostringstream(local_690);
  }
  else {
    out_img_local = (vector<float,_std::allocator<float>_> *)channels;
    if ((channel_stride == 0) ||
       (out_img_local = (vector<float,_std::allocator<float>_> *)channel_stride,
       channels <= channel_stride)) {
      uVar2 = width * height * (long)out_img_local;
      local_898 = (undefined1  [8])uVar2;
      sVar3 = ::std::vector<float,_std::allocator<float>_>::size(in_img);
      if (sVar3 < uVar2) {
        ::std::__cxx11::ostringstream::ostringstream(local_a10);
        poVar1 = ::std::operator<<((ostream *)local_a10,"[error]");
        poVar1 = ::std::operator<<(poVar1,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/image-util.cc"
                                  );
        poVar1 = ::std::operator<<(poVar1,":");
        poVar1 = ::std::operator<<(poVar1,"srgb_f32_to_linear_f32");
        poVar1 = ::std::operator<<(poVar1,"():");
        poVar1 = (ostream *)::std::ostream::operator<<(poVar1,499);
        ::std::operator<<(poVar1," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_a50,
                   "Insufficient input buffer size. must be the same or larger than {} but has {}",
                   &local_a51);
        local_a60 = ::std::vector<float,_std::allocator<float>_>::size
                              ((vector<float,_std::allocator<float>_> *)width_local);
        fmt::format<unsigned_long,unsigned_long>
                  (&local_a30,(fmt *)local_a50,(string *)local_898,&local_a60,
                   (unsigned_long *)channel_stride);
        poVar1 = ::std::operator<<((ostream *)local_a10,(string *)&local_a30);
        ::std::operator<<(poVar1,"\n");
        ::std::__cxx11::string::~string((string *)&local_a30);
        ::std::__cxx11::string::~string(local_a50);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_a51);
        if (err != (string *)0x0) {
          ::std::__cxx11::ostringstream::str();
          ::std::__cxx11::string::operator+=((string *)err,(string *)&y);
          ::std::__cxx11::string::~string((string *)&y);
        }
        in_img_local._7_1_ = 0;
        ::std::__cxx11::ostringstream::~ostringstream(local_a10);
      }
      else {
        ::std::vector<float,_std::allocator<float>_>::resize(out_img,(size_type)local_898);
        for (x = 0; x < channels_local; x = x + 1) {
          for (c = 0; c < height_local; c = c + 1) {
            for (idx = 0; idx < channel_stride_local; idx = idx + 1) {
              sVar3 = (long)out_img_local * height_local * x + (long)out_img_local * c + idx;
              pvVar4 = ::std::vector<float,_std::allocator<float>_>::operator[]
                                 ((vector<float,_std::allocator<float>_> *)width_local,sVar3);
              fVar6 = SrgbTransform::srgbToLinear(*pvVar4 * scale_factor + bias);
              pvVar5 = ::std::vector<float,_std::allocator<float>_>::operator[](out_img,sVar3);
              *pvVar5 = fVar6;
            }
            for (idx_1 = channel_stride_local; idx_1 < out_img_local; idx_1 = idx_1 + 1) {
              sVar3 = (long)out_img_local * height_local * x + (long)out_img_local * c + idx_1;
              pvVar4 = ::std::vector<float,_std::allocator<float>_>::operator[]
                                 ((vector<float,_std::allocator<float>_> *)width_local,sVar3);
              fVar6 = *pvVar4;
              pvVar5 = ::std::vector<float,_std::allocator<float>_>::operator[](out_img,sVar3);
              *pvVar5 = fVar6 * alpha_scale_factor + alpha_bias;
            }
          }
        }
        in_img_local._7_1_ = 1;
      }
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream(local_828);
      poVar1 = ::std::operator<<((ostream *)local_828,"[error]");
      poVar1 = ::std::operator<<(poVar1,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/image-util.cc"
                                );
      poVar1 = ::std::operator<<(poVar1,":");
      poVar1 = ::std::operator<<(poVar1,"srgb_f32_to_linear_f32");
      poVar1 = ::std::operator<<(poVar1,"():");
      poVar1 = (ostream *)::std::ostream::operator<<(poVar1,0x1ed);
      ::std::operator<<(poVar1," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_868,"channel_stride {} is smaller than input channels {}",&local_869);
      fmt::format<unsigned_long,unsigned_long>
                (&local_848,(fmt *)local_868,(string *)&out_img_local,&channel_stride_local,
                 (unsigned_long *)channel_stride);
      poVar1 = ::std::operator<<((ostream *)local_828,(string *)&local_848);
      ::std::operator<<(poVar1,"\n");
      ::std::__cxx11::string::~string((string *)&local_848);
      ::std::__cxx11::string::~string(local_868);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_869);
      if (err != (string *)0x0) {
        ::std::__cxx11::ostringstream::str();
        ::std::__cxx11::string::operator+=((string *)err,(string *)&dest_size);
        ::std::__cxx11::string::~string((string *)&dest_size);
      }
      in_img_local._7_1_ = 0;
      ::std::__cxx11::ostringstream::~ostringstream(local_828);
    }
  }
  return (bool)(in_img_local._7_1_ & 1);
}

Assistant:

bool srgb_f32_to_linear_f32(const std::vector<float> &in_img, size_t width,
                         size_t height,
                         size_t channels, size_t channel_stride,
                         std::vector<float> *out_img, const float scale_factor, const float bias, const float alpha_scale_factor, const float alpha_bias, std::string *err) {

  if (width == 0) {
    PUSH_ERROR_AND_RETURN("width is zero.");
  }

  if (height == 0) {
    PUSH_ERROR_AND_RETURN("height is zero.");
  }

  if (channels == 0) {
    PUSH_ERROR_AND_RETURN("channels is zero.");
  }

  if (out_img == nullptr) {
    PUSH_ERROR_AND_RETURN("`out_img` is nullptr.");
  }

  if (channel_stride == 0) {
    channel_stride = channels;
  } else {
    if (channel_stride < channels) {
      PUSH_ERROR_AND_RETURN(fmt::format("channel_stride {} is smaller than input channels {}", channel_stride, channels));
    }
  }

  size_t dest_size = size_t(width) * size_t(height) * channel_stride;
  if (dest_size > in_img.size()) {
    PUSH_ERROR_AND_RETURN(fmt::format("Insufficient input buffer size. must be the same or larger than {} but has {}", dest_size, in_img.size()));
  }

  out_img->resize(dest_size);

  // assume input is in [0.0, 1.0]
  for (size_t y = 0; y < height; y++) {
    for (size_t x = 0; x < width; x++) {
      for (size_t c = 0; c < channels; c++) {
        size_t idx = channel_stride * width * y + channel_stride * x + c;
        float f = in_img[idx] * scale_factor + bias;
        (*out_img)[idx] = SrgbTransform::srgbToLinear(f);
      }

      // remainder(usually alpha channel)
      // Apply linear conversion.
      for (size_t c = channels; c < channel_stride; c++) {
        size_t idx = channel_stride * width * y + channel_stride * x + c;
        float f = in_img[idx] * alpha_scale_factor + alpha_bias;
        (*out_img)[idx] = f;
      }
    }
  }

  return true;
}